

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

string * __thiscall
cfd::core::TapBranch::ToString_abi_cxx11_(string *__return_storage_ptr__,TapBranch *this)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  HashUtil *object;
  HashUtil *pHVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb60;
  HashUtil *in_stack_fffffffffffffb68;
  HashUtil *in_stack_fffffffffffffb70;
  undefined7 in_stack_fffffffffffffb90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  char *in_stack_fffffffffffffba8;
  allocator *paVar5;
  string local_430;
  string local_410 [32];
  string local_3f0 [32];
  string local_3d0 [32];
  string local_3b0 [32];
  undefined1 local_390 [24];
  string local_378;
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  ByteData256 local_2d8;
  uchar *local_2c0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2b8;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2b0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_2a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_2a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_288;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *hash_bytes;
  vector<unsigned_char,_std::allocator<unsigned_char>_> **local_268;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *node_bytes;
  ByteData256 node;
  undefined1 local_220 [8];
  HashUtil hasher;
  TapBranch *branch;
  const_iterator __end2;
  const_iterator __begin2;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *__range2;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  ByteData tapbranch_base;
  string local_1a0 [32];
  undefined1 local_180 [8];
  ByteData256 hash;
  allocator local_141;
  string local_140;
  string local_120 [32];
  string local_100 [32];
  string local_e0 [48];
  ByteData local_b0;
  string local_98;
  string local_78 [32];
  string local_58 [8];
  string ver_str;
  string buf;
  TapBranch *this_local;
  
  ::std::__cxx11::string::string((string *)(ver_str.field_2._M_local_buf + 8));
  if ((this->has_leaf_ & 1U) == 0) {
    bVar1 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                      (&this->branch_list_);
    if ((bVar1) && (bVar1 = ByteData256::IsEmpty(&this->root_commitment_), bVar1)) {
      paVar5 = &local_141;
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",paVar5);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_141);
      goto LAB_00491aa8;
    }
    ByteData256::GetHex_abi_cxx11_
              ((string *)
               &hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,&this->root_commitment_);
    ::std::__cxx11::string::operator=
              ((string *)(ver_str.field_2._M_local_buf + 8),
               (string *)
               &hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
    ::std::__cxx11::string::~string
              ((string *)
               &hash.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage);
  }
  else {
    ::std::__cxx11::string::string(local_58);
    if (this->leaf_version_ != 0xc0) {
      ByteData::ByteData(&local_b0,this->leaf_version_);
      ByteData::GetHex_abi_cxx11_(&local_98,&local_b0);
      ::std::operator+((char *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      ::std::__cxx11::string::operator=(local_58,local_78);
      ::std::__cxx11::string::~string(local_78);
      ::std::__cxx11::string::~string((string *)&local_98);
      ByteData::~ByteData((ByteData *)0x490ffd);
    }
    Script::GetHex_abi_cxx11_(&local_140,&this->script_);
    ::std::operator+(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
    ::std::__cxx11::string::operator=((string *)(ver_str.field_2._M_local_buf + 8),local_e0);
    ::std::__cxx11::string::~string(local_e0);
    ::std::__cxx11::string::~string(local_100);
    ::std::__cxx11::string::~string(local_120);
    ::std::__cxx11::string::~string((string *)&local_140);
    ::std::__cxx11::string::~string(local_58);
  }
  bVar1 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::empty
                    (&this->branch_list_);
  if (bVar1) {
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(ver_str.field_2._M_local_buf + 8));
  }
  else {
    GetBaseHash((ByteData256 *)local_180,this);
    if ((ToString[abi:cxx11]()::kTaggedHash == '\0') &&
       (iVar3 = __cxa_guard_acquire(&ToString[abi:cxx11]()::kTaggedHash), iVar3 != 0)) {
      in_stack_fffffffffffffba0 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((long)&tapbranch_base.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_1a0,"TapBranch",(allocator *)in_stack_fffffffffffffba0);
      HashUtil::Sha256(&ToString::kTaggedHash,(string *)local_1a0);
      ::std::__cxx11::string::~string(local_1a0);
      ::std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&tapbranch_base.data_.
                         super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + 7));
      __cxa_atexit(ByteData256::~ByteData256,&ToString::kTaggedHash,&__dso_handle);
      __cxa_guard_release(&ToString[abi:cxx11]()::kTaggedHash);
    }
    ByteData256::Concat<cfd::core::ByteData256>
              ((ByteData *)
               &nodes.
                super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage,&ToString::kTaggedHash,
               &ToString::kTaggedHash);
    (*this->_vptr_TapBranch[4])(&__range2);
    __end2 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::begin
                       (&this->branch_list_);
    branch = (TapBranch *)
             ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::end
                       (&this->branch_list_);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_cfd::core::TapBranch_*,_std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>_>
                                       *)&branch), bVar1) {
      hasher.buffer_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_cfd::core::TapBranch_*,_std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>_>
                    ::operator*(&__end2);
      HashUtil::HashUtil((HashUtil *)
                         &node.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,'\x03');
      object = HashUtil::operator<<
                         ((HashUtil *)
                          &node.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage,
                          (ByteData *)
                          &nodes.
                           super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      HashUtil::HashUtil((HashUtil *)local_220,object);
      HashUtil::~HashUtil((HashUtil *)
                          &node.data_.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage);
      GetCurrentBranchHash
                ((ByteData256 *)&node_bytes,
                 (TapBranch *)
                 hasher.buffer_.data_.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      ByteData256::GetBytes
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&hash_bytes,
                 (ByteData256 *)&node_bytes);
      local_268 = &hash_bytes;
      ByteData256::GetBytes(&local_2a0,(ByteData256 *)local_180);
      local_288 = &local_2a0;
      local_2a8._M_current =
           (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              (in_stack_fffffffffffffb58);
      local_2b0._M_current =
           (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              (in_stack_fffffffffffffb58);
      local_2b8._M_current =
           (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                              (in_stack_fffffffffffffb58);
      local_2c0 = (uchar *)::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                     (in_stack_fffffffffffffb58);
      uVar2 = ::std::
              lexicographical_compare<__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                        (local_2a8,local_2b0,local_2b8,
                         (__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                          )local_2c0);
      if ((bool)uVar2) {
        pHVar4 = HashUtil::operator<<((HashUtil *)local_220,(ByteData256 *)local_180);
        pHVar4 = HashUtil::operator<<(pHVar4,(ByteData256 *)&node_bytes);
        HashUtil::Output256(&local_2d8,pHVar4);
        ByteData256::operator=((ByteData256 *)local_180,&local_2d8);
        ByteData256::~ByteData256((ByteData256 *)0x4915a0);
        ::std::operator+(in_stack_fffffffffffffba8,in_stack_fffffffffffffba0);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
        ToString_abi_cxx11_((string *)(local_390 + 0x18),
                            (TapBranch *)
                            hasher.buffer_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)object
                         ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          CONCAT17(uVar2,in_stack_fffffffffffffb90));
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
        ::std::__cxx11::string::operator=((string *)(ver_str.field_2._M_local_buf + 8),local_2f8);
        ::std::__cxx11::string::~string(local_2f8);
        ::std::__cxx11::string::~string(local_318);
        ::std::__cxx11::string::~string((string *)(local_390 + 0x18));
        ::std::__cxx11::string::~string(local_338);
        ::std::__cxx11::string::~string(local_358);
      }
      else {
        in_stack_fffffffffffffb70 =
             HashUtil::operator<<((HashUtil *)local_220,(ByteData256 *)&node_bytes);
        in_stack_fffffffffffffb68 =
             HashUtil::operator<<(in_stack_fffffffffffffb70,(ByteData256 *)local_180);
        HashUtil::Output256((ByteData256 *)local_390,in_stack_fffffffffffffb68);
        in_stack_fffffffffffffb60 =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_390;
        ByteData256::operator=((ByteData256 *)local_180,(ByteData256 *)in_stack_fffffffffffffb60);
        ByteData256::~ByteData256((ByteData256 *)0x49187c);
        ToString_abi_cxx11_(&local_430,
                            (TapBranch *)
                            hasher.buffer_.data_.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        ::std::operator+((char *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
        ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb68,(char *)in_stack_fffffffffffffb60);
        ::std::__cxx11::string::operator=((string *)(ver_str.field_2._M_local_buf + 8),local_3b0);
        ::std::__cxx11::string::~string(local_3b0);
        ::std::__cxx11::string::~string(local_3d0);
        ::std::__cxx11::string::~string(local_3f0);
        ::std::__cxx11::string::~string(local_410);
        ::std::__cxx11::string::~string((string *)&local_430);
      }
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb70)
      ;
      ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb70)
      ;
      ByteData256::~ByteData256((ByteData256 *)0x4919f3);
      HashUtil::~HashUtil((HashUtil *)local_220);
      __gnu_cxx::
      __normal_iterator<const_cfd::core::TapBranch_*,_std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>_>
      ::operator++(&__end2);
    }
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)(ver_str.field_2._M_local_buf + 8));
    ::std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
               in_stack_fffffffffffffb70);
    ByteData::~ByteData((ByteData *)0x491a74);
    ByteData256::~ByteData256((ByteData256 *)0x491a80);
  }
LAB_00491aa8:
  ::std::__cxx11::string::~string((string *)(ver_str.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string TapBranch::ToString() const {
  std::string buf;
  if (has_leaf_) {
    std::string ver_str;
    if (leaf_version_ != TaprootScriptTree::kTapScriptLeafVersion) {
      ver_str = "," + ByteData(leaf_version_).GetHex();
    }
    buf = "tl(" + script_.GetHex() + ver_str + ")";
  } else if (branch_list_.empty() && root_commitment_.IsEmpty()) {
    return "";
  } else {
    buf = root_commitment_.GetHex();
  }
  if (branch_list_.empty()) return buf;

  ByteData256 hash = GetBaseHash();
  static auto kTaggedHash = HashUtil::Sha256("TapBranch");
  ByteData tapbranch_base = kTaggedHash.Concat(kTaggedHash);
  auto nodes = GetNodeList();
  for (const auto& branch : branch_list_) {
    auto hasher = HashUtil(HashUtil::kSha256) << tapbranch_base;
    const auto node = branch.GetCurrentBranchHash();
    const auto& node_bytes = node.GetBytes();
    const auto& hash_bytes = hash.GetBytes();
    if (std::lexicographical_compare(
            hash_bytes.begin(), hash_bytes.end(), node_bytes.begin(),
            node_bytes.end())) {
      hash = (hasher << hash << node).Output256();
      buf = "{" + buf + "," + branch.ToString() + "}";
    } else {
      hash = (hasher << node << hash).Output256();
      buf = "{" + branch.ToString() + "," + buf + "}";
    }
  }
  return buf;
}